

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O1

void __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::PurgeReleaseQueue(RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                    *this,SoftwareQueueIndex QueueInd,bool ForceRelease)

{
  CommandQueue *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  char (*in_RCX) [27];
  Uint64 CompletedFenceValue;
  ulong uVar3;
  string msg;
  string local_40;
  
  uVar3 = (ulong)QueueInd.m_Value;
  if (this->m_CmdQueueCount <= uVar3) {
    FormatString<char[26],char[27]>
              (&local_40,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x6c15c8,in_RCX);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"PurgeReleaseQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x99);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  pCVar1 = this->m_CommandQueues;
  CompletedFenceValue = 0xffffffffffffffff;
  if (!ForceRelease) {
    iVar2 = (*((pCVar1[uVar3].CmdQueue.m_pObject)->super_ICommandQueue).super_IObject._vptr_IObject
              [5])();
    CompletedFenceValue = CONCAT44(extraout_var,iVar2);
  }
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::Purge
            (&pCVar1[uVar3].ReleaseQueue,CompletedFenceValue);
  return;
}

Assistant:

void PurgeReleaseQueue(SoftwareQueueIndex QueueInd, bool ForceRelease = false)
    {
        VERIFY_EXPR(QueueInd < m_CmdQueueCount);
        auto& Queue               = m_CommandQueues[QueueInd];
        auto  CompletedFenceValue = ForceRelease ? std::numeric_limits<Uint64>::max() : Queue.CmdQueue->GetCompletedFenceValue();
        Queue.ReleaseQueue.Purge(CompletedFenceValue);
    }